

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O1

void __thiscall
Js::RootObjectInlineCache::RootObjectInlineCache
          (RootObjectInlineCache *this,InlineCacheAllocator *allocator)

{
  InlineCache *pIVar1;
  
  this->refCount = 1;
  (this->inlineCache).ptr = (InlineCache *)0x0;
  pIVar1 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,allocator,0x782450);
  Memory::Recycler::WBSetBit((char *)&this->inlineCache);
  (this->inlineCache).ptr = pIVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->inlineCache);
  return;
}

Assistant:

RootObjectInlineCache::RootObjectInlineCache(InlineCacheAllocator * allocator):
        inlineCache(nullptr), refCount(1)
    {
        inlineCache = AllocatorNewZ(InlineCacheAllocator,
            allocator, Js::InlineCache);
    }